

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O2

PHYSFS_sint64 ZIP_read(PHYSFS_Io *_io,void *buf,PHYSFS_uint64 len)

{
  ZIPfileinfo *finfo;
  ZIPentry *pZVar1;
  mz_ulong mVar2;
  int rc;
  PHYSFS_sint64 PVar3;
  PHYSFS_uint64 len_00;
  PHYSFS_sint64 PVar4;
  PHYSFS_uint64 len_01;
  
  finfo = (ZIPfileinfo *)_io->opaque;
  pZVar1 = finfo->entry;
  len_01 = pZVar1->uncompressed_size - (ulong)finfo->uncompressed_position;
  if ((long)len <= (long)len_01) {
    len_01 = len;
  }
  if (len_01 == 0) {
    PVar4 = 0;
  }
  else {
    if (pZVar1->compression_method == 0) {
      PVar4 = zip_read_decrypt(finfo,buf,len_01);
    }
    else {
      (finfo->stream).next_out = (uchar *)buf;
      (finfo->stream).avail_out = (uint)len_01;
      PVar4 = 0;
      do {
        if ((long)len_01 <= PVar4) break;
        mVar2 = (finfo->stream).total_out;
        if (((finfo->stream).avail_in == 0) &&
           (len_00 = pZVar1->compressed_size - (ulong)finfo->compressed_position, 0 < (long)len_00))
        {
          if (0x3fff < len_00) {
            len_00 = 0x4000;
          }
          PVar3 = zip_read_decrypt(finfo,finfo->buffer,len_00);
          if (PVar3 < 1) break;
          finfo->compressed_position = finfo->compressed_position + (uint)PVar3;
          (finfo->stream).next_in = finfo->buffer;
          (finfo->stream).avail_in = (uint)PVar3;
        }
        rc = mz_inflate(&finfo->stream,2);
        zlib_err(rc);
        PVar4 = PVar4 + ((finfo->stream).total_out - (ulong)(uint)mVar2);
      } while (rc == 0);
    }
    if (0 < PVar4) {
      finfo->uncompressed_position = finfo->uncompressed_position + (int)PVar4;
    }
  }
  return PVar4;
}

Assistant:

static PHYSFS_sint64 ZIP_read(PHYSFS_Io *_io, void *buf, PHYSFS_uint64 len)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) _io->opaque;
    ZIPentry *entry = finfo->entry;
    PHYSFS_sint64 retval = 0;
    PHYSFS_sint64 maxread = (PHYSFS_sint64) len;
    PHYSFS_sint64 avail = entry->uncompressed_size -
                          finfo->uncompressed_position;

    if (avail < maxread)
        maxread = avail;

    BAIL_IF_ERRPASS(maxread == 0, 0);    /* quick rejection. */

    if (entry->compression_method == COMPMETH_NONE)
        retval = zip_read_decrypt(finfo, buf, maxread);
    else
    {
        finfo->stream.next_out = buf;
        finfo->stream.avail_out = (uInt) maxread;

        while (retval < maxread)
        {
            const PHYSFS_uint32 before = (PHYSFS_uint32) finfo->stream.total_out;
            int rc;

            if (finfo->stream.avail_in == 0)
            {
                PHYSFS_sint64 br;

                br = entry->compressed_size - finfo->compressed_position;
                if (br > 0)
                {
                    if (br > ZIP_READBUFSIZE)
                        br = ZIP_READBUFSIZE;

                    br = zip_read_decrypt(finfo, finfo->buffer, (PHYSFS_uint64) br);
                    if (br <= 0)
                        break;

                    finfo->compressed_position += (PHYSFS_uint32) br;
                    finfo->stream.next_in = finfo->buffer;
                    finfo->stream.avail_in = (unsigned int) br;
                } /* if */
            } /* if */

            rc = zlib_err(inflate(&finfo->stream, Z_SYNC_FLUSH));
            retval += (finfo->stream.total_out - before);

            if (rc != Z_OK)
                break;
        } /* while */
    } /* else */

    if (retval > 0)
        finfo->uncompressed_position += (PHYSFS_uint32) retval;

    return retval;
}